

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall VectorSUnitTest_clear_Test::TestBody(VectorSUnitTest_clear_Test *this)

{
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  vec_t v;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  AssertHelper local_78;
  vector_s<S,_10UL> local_70;
  
  local_a8 = (undefined1  [8])local_98;
  local_98 = (undefined1  [8])0x1;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_88._M_allocated_capacity = 3;
  S::count_constructor = S::count_constructor + 4;
  local_88._8_8_ = 4;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  estl::vector_s<S,_10UL>::vector_s(&local_70,(initializer_list<S> *)local_a8);
  S::count_destructor = S::count_destructor + 4;
  local_a8[0] = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_70.size_ !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_70.size_ ==
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_a8,(AssertionResult *)0x15719a,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x204,(char *)local_98);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_98 != (undefined1  [8])&local_88) {
      operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
  }
  local_b0._M_head_impl._0_4_ = 4;
  local_a8 = (undefined1  [8])local_70.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"4u","v.size()",(uint *)&local_b0,(unsigned_long *)local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x205,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0._M_head_impl._0_4_ = 10;
  local_a8 = (undefined1  [8])0xa;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"10u","v.capacity()",(uint *)&local_b0,(unsigned_long *)local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x206,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b0._M_head_impl._0_4_ = 10;
  local_a8 = (undefined1  [8])0xa;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"10u","v.max_size()",(uint *)&local_b0,(unsigned_long *)local_a8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x207,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_a8._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"4u","S::count_constructor",(uint *)local_a8,&S::count_constructor
            );
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x208,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_a8._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"4u","S::count_destructor",(uint *)local_a8,&S::count_destructor);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x209,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70.size_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    S::count_destructor = S::count_destructor + local_70.size_;
  }
  local_70.size_ = 0;
  local_a8 = (undefined1  [8])0x0;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_98,"static_cast<size_t>(0u)","v.size()",(unsigned_long *)local_a8,
             (unsigned_long *)&local_b0);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x20b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_a8._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_98,"8u","S::count_destructor",(uint *)local_a8,&S::count_destructor);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x20c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_t *)local_a8 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if (local_70.size_ != 0) {
    S::count_destructor = S::count_destructor + local_70.size_;
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, clear)
{
    using vec_t = vector_s<S, 10>;
    vec_t v{S(1u),S(2u),S(3u),S(4u)};
    EXPECT_FALSE(v.empty());
    EXPECT_EQ(4u, v.size());
    EXPECT_EQ(10u, v.capacity());
    EXPECT_EQ(10u, v.max_size());
    EXPECT_EQ(4u, S::count_constructor);
    EXPECT_EQ(4u, S::count_destructor);
    v.clear();
    EXPECT_EQ(static_cast<size_t>(0u), v.size());
    EXPECT_EQ(8u, S::count_destructor);
}